

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRenderer.cpp
# Opt level: O1

GdlRuleTable * __thiscall
GdlRenderer::GetRuleTable(GdlRenderer *this,GrpLineAndFile *lnf,string *staTableName)

{
  pointer *pppGVar1;
  pointer pcVar2;
  iterator __position;
  int iVar3;
  GrcSymbolTable *this_00;
  bool bVar4;
  Symbol this_01;
  GdlRuleTable *this_02;
  GdlRuleTable *prultbl;
  GdlRuleTable *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar2 = (staTableName->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + staTableName->_M_string_length);
  local_d8 = FindRuleTable(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_00 = g_cman.m_psymtbl;
  if (local_d8 == (GdlRuleTable *)0x0) {
    pcVar2 = (staTableName->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + staTableName->_M_string_length);
    this_01 = GrcSymbolTable::FindSymbol(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((this_01 == (Symbol)0x0) ||
       (bVar4 = GrcSymbolTableEntry::FitsSymbolType(this_01,ksymtTableRule), !bVar4)) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"The ","");
      pcVar2 = (staTableName->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + staTableName->_M_string_length);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0," table cannot hold rules","");
      GrcErrorList::AddItem
                (&g_errorList,true,0x872,(GdlObject *)0x0,lnf,&local_d0,&local_90,&local_b0,
                 (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_d8 = (GdlRuleTable *)0x0;
    }
    else {
      this_02 = (GdlRuleTable *)operator_new(0x50);
      GdlObject::GdlObject((GdlObject *)this_02);
      this_02->m_psymName = this_01;
      this_02->m_fSubstitution = false;
      (this_02->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_02->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_02->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar3 = lnf->m_nLineOrig;
      (this_02->super_GdlObject).m_lnf.m_nLinePre = lnf->m_nLinePre;
      (this_02->super_GdlObject).m_lnf.m_nLineOrig = iVar3;
      local_d8 = this_02;
      std::__cxx11::string::_M_assign((string *)&(this_02->super_GdlObject).m_lnf.m_staFile);
      __position._M_current =
           (this->m_vprultbl).super__Vector_base<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vprultbl).super__Vector_base<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<GdlRuleTable*,std::allocator<GdlRuleTable*>>::
        _M_realloc_insert<GdlRuleTable*const&>
                  ((vector<GdlRuleTable*,std::allocator<GdlRuleTable*>> *)&this->m_vprultbl,
                   __position,&local_d8);
      }
      else {
        *__position._M_current = local_d8;
        pppGVar1 = &(this->m_vprultbl).
                    super__Vector_base<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppGVar1 = *pppGVar1 + 1;
      }
    }
  }
  return local_d8;
}

Assistant:

GdlRuleTable * GdlRenderer::GetRuleTable(GrpLineAndFile & lnf, std::string staTableName)
{
	GdlRuleTable * prultbl = FindRuleTable(staTableName);

	if (prultbl)
		return prultbl;

	//	Create a new one, if permissible.

	Symbol psymTableName = g_cman.SymbolTable()->FindSymbol(staTableName);
	Assert(psymTableName);
	if (!psymTableName || !psymTableName->FitsSymbolType(ksymtTableRule))
	{
		g_errorList.AddError(2162, NULL,
			"The ",
			staTableName,
			" table cannot hold rules",
			lnf);
		return NULL;
	}

	prultbl = new GdlRuleTable(psymTableName);
	prultbl->SetLineAndFile(lnf);
	m_vprultbl.push_back(prultbl);

	return prultbl;
}